

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O3

_Bool compare_record_with_label(void *record,void *label)

{
  int iVar1;
  
  if (*(char *)((long)record + 0x14) != '\0') {
    iVar1 = strcmp((char *)**record,(char *)label);
    return iVar1 == 0;
  }
  puts("error");
  exit(0);
}

Assistant:

static inline bool compare_record_with_label(void* record,void*label){
  // struct record_data* record = ()_recor
  // log_debug("%s %s",(((struct record_data*)((struct record*)record)->data)->label),label);
  if (!(((struct record*)record)->valid)){
    printf("error\n");
    exit(0);
  }
  return !strcmp(((struct record_data*)((struct record*)record)->data)->label, label);
}